

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdCut.c
# Opt level: O0

void Sbd_StoComputeCutsObj(Sbd_Sto_t *p,int iObj,int Delay,int Level)

{
  int iVar1;
  int Level_local;
  int Delay_local;
  int iObj_local;
  Sbd_Sto_t *p_local;
  
  iVar1 = Vec_IntSize(p->vDelays);
  if (iObj < iVar1) {
    Vec_IntWriteEntry(p->vDelays,iObj,Delay);
    Vec_IntWriteEntry(p->vLevels,iObj,Level);
  }
  else {
    iVar1 = Vec_IntSize(p->vDelays);
    if (iObj != iVar1) {
      __assert_fail("iObj == Vec_IntSize(p->vDelays)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdCut.c"
                    ,0x2c7,"void Sbd_StoComputeCutsObj(Sbd_Sto_t *, int, int, int)");
    }
    iVar1 = Vec_IntSize(p->vLevels);
    if (iObj != iVar1) {
      __assert_fail("iObj == Vec_IntSize(p->vLevels)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdCut.c"
                    ,0x2c8,"void Sbd_StoComputeCutsObj(Sbd_Sto_t *, int, int, int)");
    }
    iVar1 = Vec_WecSize(p->vCuts);
    if (iObj != iVar1) {
      __assert_fail("iObj == Vec_WecSize(p->vCuts)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdCut.c"
                    ,0x2c9,"void Sbd_StoComputeCutsObj(Sbd_Sto_t *, int, int, int)");
    }
    Vec_IntPush(p->vDelays,Delay);
    Vec_IntPush(p->vLevels,Level);
    Vec_WecPushLevel(p->vCuts);
  }
  return;
}

Assistant:

void Sbd_StoComputeCutsObj( Sbd_Sto_t * p, int iObj, int Delay, int Level )
{
    if ( iObj < Vec_IntSize(p->vDelays) )
    {
        Vec_IntWriteEntry( p->vDelays, iObj, Delay );
        Vec_IntWriteEntry( p->vLevels, iObj, Level );
    }
    else
    {
        assert( iObj == Vec_IntSize(p->vDelays) );
        assert( iObj == Vec_IntSize(p->vLevels) );
        assert( iObj == Vec_WecSize(p->vCuts) );
        Vec_IntPush( p->vDelays, Delay );
        Vec_IntPush( p->vLevels, Level );
        Vec_WecPushLevel( p->vCuts );
    }
}